

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_soundfile_aiff.c
# Opt level: O2

int aiff_updateheader(t_soundfile *sf,size_t nframes)

{
  int iVar1;
  int iVar2;
  int32_t iVar3;
  ssize_t sVar4;
  uint doit;
  long lVar5;
  uint uVar6;
  bool bVar7;
  long lStack_40;
  int32_t inttmp;
  uint32_t uinttmp;
  
  if (sf->sf_bigendian == 0) {
    bVar7 = false;
  }
  else {
    bVar7 = sf->sf_bytespersample != 4;
  }
  iVar2 = sys_isbigendian();
  if (bVar7) {
    lVar5 = 0x1a;
    lStack_40 = 0xc;
  }
  else {
    lVar5 = 0x2e;
    if (sf->sf_bytespersample == 4) {
      lVar5 = 0x34;
    }
    lStack_40 = 0x18;
  }
  iVar1 = sf->sf_bytesperframe;
  doit = (uint)(iVar2 == 0);
  uinttmp = swap4((uint32_t)nframes,doit);
  sVar4 = fd_write(sf->sf_fd,lStack_40 + 10,&uinttmp,4);
  uVar6 = 0;
  if (3 < sVar4) {
    iVar1 = iVar1 * (uint32_t)nframes;
    inttmp = swap4s(iVar1 + 8,doit);
    sVar4 = fd_write(sf->sf_fd,lVar5 + lStack_40 + 4,&inttmp,4);
    if (3 < sVar4) {
      iVar3 = swap4s(iVar1 + (int)lVar5 + (int)lStack_40 + 8,doit);
      _inttmp = CONCAT44(uinttmp,iVar3);
      sVar4 = fd_write(sf->sf_fd,4,&inttmp,4);
      uVar6 = (uint)(3 < sVar4);
    }
  }
  return uVar6;
}

Assistant:

static int aiff_updateheader(t_soundfile *sf, size_t nframes)
{
    int isaiffc = aiff_isaiffc(sf), swap = !sys_isbigendian();
    size_t datasize = nframes * sf->sf_bytesperframe,
           headersize = AIFFHEADSIZE, commsize = AIFFCOMMSIZE;
    uint32_t uinttmp;
    int32_t inttmp;

    if (isaiffc)
    {
            /* AIFF-C compression info */
        if (sf->sf_bytespersample == 4)
            commsize += 4 + AIFF_FL32_LEN;
        else
            commsize += 4 + AIFF_NONE_LEN;
        headersize += AIFFVERSIZE;
    }

        /* num frames */
    uinttmp = swap4((uint32_t)nframes, swap);
    if (fd_write(sf->sf_fd, headersize + 10, &uinttmp, 4) < 4)
        return 0;
    headersize += commsize;

        /* data chunk size (+ offset & block) */
    inttmp = swap4s((int32_t)datasize + 8, swap);
    if (fd_write(sf->sf_fd, headersize + 4, &inttmp, 4) < 4)
        return 0;
    headersize += AIFFDATASIZE;

        /* file header chunk size (- chunk header) */
    inttmp = swap4s((int32_t)(headersize + datasize - 8), swap);
    if (fd_write(sf->sf_fd, 4, &inttmp, 4) < 4)
        return 0;

#ifdef DEBUG_SOUNDFILE
    post("FORM %d", headersize + datasize - 8);
    post("  %s", (aiff_isaiffc(sf) ? "AIFC" : "AIFF"));
    post("COMM %d", commsize);
    post("  frames %d", nframes);
    post("SSND %d", datasize + 8);
#endif

    return 1;
}